

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O3

char * Curl_chunked_strerror(CHUNKcode code)

{
  if ((uint)(code + CHUNKE_STOP) < 6) {
    return &DAT_004f8da4 + *(int *)(&DAT_004f8da4 + (ulong)(uint)(code + CHUNKE_STOP) * 4);
  }
  return "OK";
}

Assistant:

const char *Curl_chunked_strerror(CHUNKcode code)
{
  switch (code) {
  default:
    return "OK";
  case CHUNKE_TOO_LONG_HEX:
    return "Too long hexadecimal number";
  case CHUNKE_ILLEGAL_HEX:
    return "Illegal or missing hexadecimal sequence";
  case CHUNKE_BAD_CHUNK:
    return "Malformed encoding found";
  case CHUNKE_WRITE_ERROR:
    return "Write error";
  case CHUNKE_BAD_ENCODING:
    return "Bad content-encoding found";
  case CHUNKE_OUT_OF_MEMORY:
    return "Out of memory";
  }
}